

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_list * mg_list_alloc(uint32_t size,mg_allocator *allocator)

{
  mg_list *pmVar1;
  
  pmVar1 = (mg_list *)mg_allocator_malloc(allocator,(ulong)size * 8 + 0x10);
  if (pmVar1 != (mg_list *)0x0) {
    pmVar1->elements = (mg_value **)(pmVar1 + 1);
  }
  return pmVar1;
}

Assistant:

mg_list *mg_list_alloc(uint32_t size, mg_allocator *allocator) {
  size_t elements_size = size * sizeof(mg_value *);
  char *block = mg_allocator_malloc(allocator, sizeof(mg_list) + elements_size);
  if (!block) {
    return NULL;
  }
  mg_list *list = (mg_list *)block;
  list->elements = (mg_value **)(block + sizeof(mg_list));
  return list;
}